

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cc
# Opt level: O0

Int __thiscall ipx::Control::InterruptCheck(Control *this,Int ipm_iteration_count)

{
  bool bVar1;
  byte bVar2;
  undefined4 in_ESI;
  long in_RDI;
  double dVar3;
  reference rVar4;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  uint7 in_stack_ffffffffffffff88;
  bool bVar5;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff90;
  allocator local_49;
  string local_48 [16];
  string *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  HighsCallback *in_stack_ffffffffffffffd8;
  
  HighsTaskExecutor::getThisWorkerDeque();
  HighsSplitDeque::checkInterrupt
            ((HighsSplitDeque *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  if (0.0 <= *(double *)(in_RDI + 0x18)) {
    in_stack_ffffffffffffff90 = *(vector<bool,_std::allocator<bool>_> **)(in_RDI + 0x18);
    dVar3 = Timer::Elapsed((Timer *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    if ((double)in_stack_ffffffffffffff90 < dVar3) {
      return 999;
    }
  }
  if (*(long *)(in_RDI + 0xf0) != 0) {
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
                        *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    bVar5 = false;
    if (bVar1) {
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_ffffffffffffff90,(ulong)in_stack_ffffffffffffff88);
      in_stack_ffffffffffffffd8 = (HighsCallback *)rVar4._M_p;
      bVar5 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffd8)
      ;
    }
    if (bVar5 != false) {
      HighsCallback::clearHighsCallbackDataOut(*(HighsCallback **)(in_RDI + 0xf0));
      *(undefined4 *)(*(long *)(in_RDI + 0xf0) + 0x6c) = in_ESI;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"IPM interrupt",&local_49);
      bVar2 = HighsCallback::callbackAction
                        (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                         in_stack_ffffffffffffffc8);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      if ((bVar2 & 1) != 0) {
        return 0x3e6;
      }
    }
  }
  return 0;
}

Assistant:

Int Control::InterruptCheck(const Int ipm_iteration_count) const {
    HighsTaskExecutor::getThisWorkerDeque()->checkInterrupt();
    if (parameters_.time_limit >= 0.0 &&
        parameters_.time_limit < timer_.Elapsed())
        return IPX_ERROR_time_interrupt;
    // The pointer callback_ should not be null, since that indicates
    // that it's not been set
    assert(callback_);
    if (callback_) {
      if (callback_->user_callback && callback_->active[kCallbackIpmInterrupt]) {
	callback_->clearHighsCallbackDataOut();
	callback_->data_out.ipm_iteration_count = ipm_iteration_count;
	if (callback_->callbackAction(kCallbackIpmInterrupt,
				      "IPM interrupt"))
	  return IPX_ERROR_user_interrupt;
      }
    }
    return 0;
}